

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char * string_feeder_next_length(string_feeder_t *sf,size_t length)

{
  char cVar1;
  char *pcVar2;
  int local_24;
  int i;
  char *substr;
  size_t length_local;
  string_feeder_t *sf_local;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x1f6,"char *string_feeder_next_length(string_feeder_t *, size_t)");
  }
  if (sf->len < sf->pos) {
    __assert_fail("sf->pos <= sf->len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x1f8,"char *string_feeder_next_length(string_feeder_t *, size_t)");
  }
  substr = (char *)length;
  if (sf->len < sf->pos + length) {
    substr = (char *)(sf->len - sf->pos);
  }
  pcVar2 = (char *)calloc((size_t)(substr + 1),1);
  for (local_24 = 0; (char *)(long)local_24 < substr; local_24 = local_24 + 1) {
    cVar1 = string_feeder_next(sf);
    pcVar2[local_24] = cVar1;
  }
  return pcVar2;
}

Assistant:

char *string_feeder_next_length(string_feeder_t *sf, size_t length)
{
    assert(sf != NULL);
    assert(length >= 0);
    assert(sf->pos <= sf->len);

    if (sf->pos + length > sf->len)
        length = sf->len - sf->pos;

    char *substr = calloc(length+1, sizeof(char));
    for (int i = 0 ; i < length ; i++)
        substr[i] = string_feeder_next(sf);
    return substr;
}